

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O0

void get_msurf_descriptor_haar_unroll_2_6_False(integral_image *iimage,interest_point *ipoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int row;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  float *in_RSI;
  integral_image *in_RDI;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  integral_image *iimage_00;
  float *haarX;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k_2;
  int gauss_index_k;
  float gauss_s1_y;
  int l_2;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int sample_x_sub_int_scale5_1;
  int sample_x_sub_int_scale4_1;
  int sample_x_sub_int_scale3_1;
  int sample_x_sub_int_scale2_1;
  int sample_x_sub_int_scale1_1;
  int sample_x_sub_int_scale0_1;
  int k_count5_1;
  int k_count4_1;
  int k_count3_1;
  int k_count2_1;
  int k_count1_1;
  int k_count0_1;
  int k5_1;
  int k4_1;
  int k3_1;
  int k2_1;
  int k1_1;
  int k0_1;
  int k_count_1;
  int k_1;
  int sample_y_sub_int_scale1_1;
  int sample_y_sub_int_scale0_1;
  int l_count1_1;
  int l_count0_1;
  int l1_1;
  int l0_1;
  int l_count_1;
  int l_1;
  int sample_x_sub_int_scale5;
  int sample_x_sub_int_scale4;
  int sample_x_sub_int_scale3;
  int sample_x_sub_int_scale2;
  int sample_x_sub_int_scale1;
  int sample_x_sub_int_scale0;
  float ipoint_x_sub_int_scale_add_k5_mul_scale;
  float ipoint_x_sub_int_scale_add_k4_mul_scale;
  float ipoint_x_sub_int_scale_add_k3_mul_scale;
  float ipoint_x_sub_int_scale_add_k2_mul_scale;
  float ipoint_x_sub_int_scale_add_k1_mul_scale;
  float ipoint_x_sub_int_scale_add_k0_mul_scale;
  int k_count5;
  int k_count4;
  int k_count3;
  int k_count2;
  int k_count1;
  int k_count0;
  int k5;
  int k4;
  int k3;
  int k2;
  int k1;
  int k0;
  int k_count;
  int k;
  int sample_y_sub_int_scale1;
  int sample_y_sub_int_scale0;
  float ipoint_y_sub_int_scale_add_l1_mul_scale;
  float ipoint_y_sub_int_scale_add_l0_mul_scale;
  int l_count1;
  int l_count0;
  int l1;
  int l0;
  int l_count;
  int l;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  double local_2f8;
  float *haarY;
  undefined8 uVar99;
  double local_268;
  int local_244;
  int local_210;
  int local_20c;
  int local_204;
  int local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float *local_1e8;
  int local_1dc;
  float *local_1d0;
  int local_1c8;
  int local_10c;
  int local_108;
  int local_ec;
  int local_e8;
  int local_80;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  
  fVar35 = in_RSI[2];
  auVar28._8_4_ = 0x80000000;
  auVar28._0_8_ = 0x8000000080000000;
  auVar28._12_4_ = 0x80000000;
  auVar22._8_4_ = 0x3effffff;
  auVar22._0_8_ = 0x3effffff3effffff;
  auVar22._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar22,ZEXT416((uint)fVar35),auVar28,0xf8);
  auVar20 = vroundss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)(fVar35 + auVar20._0_4_)),0xb);
  iVar12 = (int)auVar20._0_4_;
  fVar30 = -0.08 / (fVar35 * fVar35);
  fVar1 = *in_RSI;
  auVar29._8_4_ = 0x80000000;
  auVar29._0_8_ = 0x8000000080000000;
  auVar29._12_4_ = 0x80000000;
  auVar23._8_4_ = 0x3effffff;
  auVar23._0_8_ = 0x3effffff3effffff;
  auVar23._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar23,ZEXT416((uint)fVar1),auVar29,0xf8);
  auVar20 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar20._0_4_)),0xb);
  auVar26._0_8_ = (double)auVar20._0_4_;
  auVar26._8_8_ = 0;
  auVar20._0_8_ = (double)fVar35;
  auVar20._8_8_ = 0;
  auVar20 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar20,auVar26);
  fVar31 = (float)auVar20._0_8_;
  fVar1 = in_RSI[1];
  auVar82._8_4_ = 0x80000000;
  auVar82._0_8_ = 0x8000000080000000;
  auVar82._12_4_ = 0x80000000;
  auVar24._8_4_ = 0x3effffff;
  auVar24._0_8_ = 0x3effffff3effffff;
  auVar24._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar24,ZEXT416((uint)fVar1),auVar82,0xf8);
  auVar20 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(fVar1 + auVar20._0_4_)),0xb);
  auVar27._0_8_ = (double)auVar20._0_4_;
  auVar27._8_8_ = 0;
  auVar21._0_8_ = (double)fVar35;
  auVar21._8_8_ = 0;
  auVar20 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar21,auVar27);
  fVar32 = (float)auVar20._0_8_;
  fVar1 = fVar31 - (float)iVar12;
  fVar2 = (fVar31 - (float)iVar12) + 0.5;
  fVar3 = (fVar32 - (float)iVar12) + 0.5;
  local_4c = 0;
  local_50 = 0.0;
  local_54 = 0;
  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar35),
                            ZEXT416((uint)fVar31));
  auVar83._8_4_ = 0x80000000;
  auVar83._0_8_ = 0x8000000080000000;
  auVar83._12_4_ = 0x80000000;
  auVar25._8_4_ = 0x3effffff;
  auVar25._0_8_ = 0x3effffff3effffff;
  auVar25._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar25,auVar20,auVar83,0xf8);
  auVar20 = vroundss_avx(auVar20,ZEXT416((uint)(auVar20._0_4_ + auVar21._0_4_)),0xb);
  auVar48 = ZEXT1664(auVar20);
  if (0 < (int)auVar20._0_4_ - iVar12) {
    auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar35),
                              ZEXT416((uint)fVar32));
    auVar84._8_4_ = 0x80000000;
    auVar84._0_8_ = 0x8000000080000000;
    auVar84._12_4_ = 0x80000000;
    auVar49._8_4_ = 0x3effffff;
    auVar49._0_8_ = 0x3effffff3effffff;
    auVar49._12_4_ = 0x3effffff;
    auVar21 = vpternlogd_avx512vl(auVar49,auVar20,auVar84,0xf8);
    auVar20 = vroundss_avx(auVar20,ZEXT416((uint)(auVar20._0_4_ + auVar21._0_4_)),0xb);
    auVar48 = ZEXT1664(auVar20);
    if (0 < (int)auVar20._0_4_ - iVar12) {
      auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar35),
                                ZEXT416((uint)fVar31));
      auVar85._8_4_ = 0x80000000;
      auVar85._0_8_ = 0x8000000080000000;
      auVar85._12_4_ = 0x80000000;
      auVar50._8_4_ = 0x3effffff;
      auVar50._0_8_ = 0x3effffff3effffff;
      auVar50._12_4_ = 0x3effffff;
      auVar21 = vpternlogd_avx512vl(auVar50,auVar20,auVar85,0xf8);
      auVar20 = vroundss_avx(auVar20,ZEXT416((uint)(auVar20._0_4_ + auVar21._0_4_)),0xb);
      auVar48 = ZEXT1664(auVar20);
      if ((int)auVar20._0_4_ + iVar12 <= in_RDI->width) {
        auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41300000),0),ZEXT416((uint)fVar35),
                                  ZEXT416((uint)fVar32));
        auVar86._8_4_ = 0x80000000;
        auVar86._0_8_ = 0x8000000080000000;
        auVar86._12_4_ = 0x80000000;
        auVar51._8_4_ = 0x3effffff;
        auVar51._0_8_ = 0x3effffff3effffff;
        auVar51._12_4_ = 0x3effffff;
        auVar21 = vpternlogd_avx512vl(auVar51,auVar20,auVar86,0xf8);
        auVar20 = vroundss_avx(auVar20,ZEXT416((uint)(auVar20._0_4_ + auVar21._0_4_)),0xb);
        auVar48 = ZEXT1664(auVar20);
        if ((int)auVar20._0_4_ + iVar12 <= in_RDI->height) {
          local_ec = 0;
          for (local_e8 = -0xc; local_e8 < 0xc; local_e8 = local_e8 + 2) {
            iVar13 = local_ec + 1;
            auVar60._0_4_ = (float)local_e8;
            auVar60._4_12_ = auVar48._4_12_;
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar60,ZEXT416((uint)fVar3));
            iVar14 = (int)auVar20._0_4_;
            auVar61._0_4_ = (float)(local_e8 + 1);
            auVar61._4_12_ = auVar20._4_12_;
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar61,ZEXT416((uint)fVar3));
            auVar48 = ZEXT1664(auVar20);
            row = (int)auVar20._0_4_;
            local_10c = 0;
            for (local_108 = -0xc; local_108 < 0xc; local_108 = local_108 + 6) {
              iVar15 = local_10c + 1;
              iVar16 = local_10c + 2;
              iVar17 = local_10c + 3;
              iVar18 = local_10c + 4;
              iVar19 = local_10c + 5;
              auVar62._0_4_ = (float)local_108;
              auVar62._4_12_ = auVar48._4_12_;
              auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar62,ZEXT416((uint)fVar2));
              auVar63._0_4_ = (float)(local_108 + 1);
              auVar63._4_12_ = auVar20._4_12_;
              auVar21 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar63,ZEXT416((uint)fVar2));
              auVar64._0_4_ = (float)(local_108 + 2);
              auVar64._4_12_ = auVar21._4_12_;
              auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar64,ZEXT416((uint)fVar2));
              auVar65._0_4_ = (float)(local_108 + 3);
              auVar65._4_12_ = auVar22._4_12_;
              auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar65,ZEXT416((uint)fVar2));
              auVar66._0_4_ = (float)(local_108 + 4);
              auVar66._4_12_ = auVar23._4_12_;
              auVar24 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar66,ZEXT416((uint)fVar2));
              auVar67._0_4_ = (float)(local_108 + 5);
              auVar67._4_12_ = auVar24._4_12_;
              auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar67,ZEXT416((uint)fVar2));
              auVar48 = ZEXT1664(auVar25);
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar20._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + local_10c),
                         haarResponseY + (local_ec * 0x18 + local_10c));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar21._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + iVar15),
                         haarResponseY + (local_ec * 0x18 + iVar15));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar22._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + iVar16),
                         haarResponseY + (local_ec * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar23._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + iVar17),
                         haarResponseY + (local_ec * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar24._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + iVar18),
                         haarResponseY + (local_ec * 0x18 + iVar18));
              haarXY_unconditional
                        (in_RDI,iVar14,(int)auVar25._0_4_,iVar12,
                         haarResponseX + (local_ec * 0x18 + iVar19),
                         haarResponseY + (local_ec * 0x18 + iVar19));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar20._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + local_10c),
                         haarResponseY + (iVar13 * 0x18 + local_10c));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar21._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar15),
                         haarResponseY + (iVar13 * 0x18 + iVar15));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar22._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar16),
                         haarResponseY + (iVar13 * 0x18 + iVar16));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar23._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar17),
                         haarResponseY + (iVar13 * 0x18 + iVar17));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar24._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar18),
                         haarResponseY + (iVar13 * 0x18 + iVar18));
              haarXY_unconditional
                        (in_RDI,row,(int)auVar25._0_4_,iVar12,
                         haarResponseX + (iVar13 * 0x18 + iVar19),
                         haarResponseY + (iVar13 * 0x18 + iVar19));
              local_10c = local_10c + 6;
            }
            local_ec = local_ec + 2;
          }
          goto LAB_001d658a;
        }
      }
    }
  }
  for (local_58 = -0xc; local_58 < 0xc; local_58 = local_58 + 2) {
    auVar52._0_4_ = (float)local_58;
    auVar52._4_12_ = auVar48._4_12_;
    auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar52,ZEXT416((uint)(fVar32 - (float)iVar12)))
    ;
    auVar53._0_4_ = (float)(local_58 + 1);
    auVar53._4_12_ = auVar20._4_12_;
    auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar53,ZEXT416((uint)(fVar32 - (float)iVar12)))
    ;
    local_268 = 0.5;
    if (auVar20._0_4_ < 0.0) {
      local_268 = -0.5;
    }
    auVar48 = ZEXT864((ulong)((double)auVar20._0_4_ + local_268));
    for (local_80 = -0xc; local_80 < 0xc; local_80 = local_80 + 6) {
      auVar54._0_4_ = (float)local_80;
      auVar54._4_12_ = auVar48._4_12_;
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar54,ZEXT416((uint)fVar1));
      auVar55._0_4_ = (float)(local_80 + 1);
      auVar55._4_12_ = auVar20._4_12_;
      auVar21 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar55,ZEXT416((uint)fVar1));
      auVar56._0_4_ = (float)(local_80 + 2);
      auVar56._4_12_ = auVar21._4_12_;
      auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar56,ZEXT416((uint)fVar1));
      auVar57._0_4_ = (float)(local_80 + 3);
      auVar57._4_12_ = auVar22._4_12_;
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar57,ZEXT416((uint)fVar1));
      auVar58._0_4_ = (float)(local_80 + 4);
      auVar58._4_12_ = auVar23._4_12_;
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar58,ZEXT416((uint)fVar1));
      auVar59._0_4_ = (float)(local_80 + 5);
      auVar59._4_12_ = auVar23._4_12_;
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar35),auVar59,ZEXT416((uint)fVar1));
      iimage_00 = (integral_image *)(double)auVar20._0_4_;
      haarX = (float *)(double)auVar21._0_4_;
      iVar13 = -0x40200000;
      uVar99 = 0x3fe0000000000000;
      if (auVar21._0_4_ < 0.0) {
        uVar99 = 0xbfe0000000000000;
      }
      haarY = (float *)0x3fe0000000000000;
      if (auVar22._0_4_ < 0.0) {
        haarY = (float *)0xbfe0000000000000;
      }
      local_2f8 = 0.5;
      if (auVar23._0_4_ < 0.0) {
        local_2f8 = -0.5;
      }
      auVar48 = ZEXT864((ulong)((double)auVar23._0_4_ + local_2f8));
      haarXY_precheck_boundaries(iimage_00,(int)((ulong)uVar99 >> 0x20),0,-0x40200000,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
      haarXY_precheck_boundaries
                (iimage_00,(int)((ulong)uVar99 >> 0x20),(int)uVar99,iVar13,haarX,haarY);
    }
  }
LAB_001d658a:
  auVar36._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar36._0_4_ = fVar35 * 0.5;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar68._8_4_ = 0x3effffff;
  auVar68._0_8_ = 0x3effffff3effffff;
  auVar68._12_4_ = 0x3effffff;
  auVar20 = vpternlogd_avx512vl(auVar68,auVar36,auVar87,0xf8);
  auVar20 = vroundss_avx(auVar36,ZEXT416((uint)(fVar35 * 0.5 + auVar20._0_4_)),0xb);
  auVar37._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar37._0_4_ = fVar35 * 1.5;
  auVar88._8_4_ = 0x80000000;
  auVar88._0_8_ = 0x8000000080000000;
  auVar88._12_4_ = 0x80000000;
  auVar69._8_4_ = 0x3effffff;
  auVar69._0_8_ = 0x3effffff3effffff;
  auVar69._12_4_ = 0x3effffff;
  auVar21 = vpternlogd_avx512vl(auVar69,auVar37,auVar88,0xf8);
  auVar21 = vroundss_avx(auVar37,ZEXT416((uint)(fVar35 * 1.5 + auVar21._0_4_)),0xb);
  auVar38._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar38._0_4_ = fVar35 * 2.5;
  auVar89._8_4_ = 0x80000000;
  auVar89._0_8_ = 0x8000000080000000;
  auVar89._12_4_ = 0x80000000;
  auVar70._8_4_ = 0x3effffff;
  auVar70._0_8_ = 0x3effffff3effffff;
  auVar70._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar70,auVar38,auVar89,0xf8);
  auVar22 = vroundss_avx(auVar38,ZEXT416((uint)(fVar35 * 2.5 + auVar22._0_4_)),0xb);
  fVar33 = auVar22._0_4_;
  auVar39._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar39._0_4_ = fVar35 * 3.5;
  auVar90._8_4_ = 0x80000000;
  auVar90._0_8_ = 0x8000000080000000;
  auVar90._12_4_ = 0x80000000;
  auVar71._8_4_ = 0x3effffff;
  auVar71._0_8_ = 0x3effffff3effffff;
  auVar71._12_4_ = 0x3effffff;
  auVar22 = vpternlogd_avx512vl(auVar71,auVar39,auVar90,0xf8);
  auVar22 = vroundss_avx(auVar39,ZEXT416((uint)(fVar35 * 3.5 + auVar22._0_4_)),0xb);
  auVar40._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar40._0_4_ = fVar35 * 4.5;
  auVar91._8_4_ = 0x80000000;
  auVar91._0_8_ = 0x8000000080000000;
  auVar91._12_4_ = 0x80000000;
  auVar72._8_4_ = 0x3effffff;
  auVar72._0_8_ = 0x3effffff3effffff;
  auVar72._12_4_ = 0x3effffff;
  auVar23 = vpternlogd_avx512vl(auVar72,auVar40,auVar91,0xf8);
  auVar23 = vroundss_avx(auVar40,ZEXT416((uint)(fVar35 * 4.5 + auVar23._0_4_)),0xb);
  auVar41._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar41._0_4_ = fVar35 * 5.5;
  auVar92._8_4_ = 0x80000000;
  auVar92._0_8_ = 0x8000000080000000;
  auVar92._12_4_ = 0x80000000;
  auVar73._8_4_ = 0x3effffff;
  auVar73._0_8_ = 0x3effffff3effffff;
  auVar73._12_4_ = 0x3effffff;
  auVar24 = vpternlogd_avx512vl(auVar73,auVar41,auVar92,0xf8);
  auVar24 = vroundss_avx(auVar41,ZEXT416((uint)(fVar35 * 5.5 + auVar24._0_4_)),0xb);
  auVar42._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar42._0_4_ = fVar35 * 6.5;
  auVar93._8_4_ = 0x80000000;
  auVar93._0_8_ = 0x8000000080000000;
  auVar93._12_4_ = 0x80000000;
  auVar74._8_4_ = 0x3effffff;
  auVar74._0_8_ = 0x3effffff3effffff;
  auVar74._12_4_ = 0x3effffff;
  auVar25 = vpternlogd_avx512vl(auVar74,auVar42,auVar93,0xf8);
  auVar25 = vroundss_avx(auVar42,ZEXT416((uint)(fVar35 * 6.5 + auVar25._0_4_)),0xb);
  auVar43._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar43._0_4_ = fVar35 * 7.5;
  auVar94._8_4_ = 0x80000000;
  auVar94._0_8_ = 0x8000000080000000;
  auVar94._12_4_ = 0x80000000;
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar75,auVar43,auVar94,0xf8);
  auVar26 = vroundss_avx(auVar43,ZEXT416((uint)(fVar35 * 7.5 + auVar26._0_4_)),0xb);
  fVar34 = auVar26._0_4_;
  auVar44._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar44._0_4_ = fVar35 * 8.5;
  auVar95._8_4_ = 0x80000000;
  auVar95._0_8_ = 0x8000000080000000;
  auVar95._12_4_ = 0x80000000;
  auVar76._8_4_ = 0x3effffff;
  auVar76._0_8_ = 0x3effffff3effffff;
  auVar76._12_4_ = 0x3effffff;
  auVar26 = vpternlogd_avx512vl(auVar76,auVar44,auVar95,0xf8);
  auVar26 = vroundss_avx(auVar44,ZEXT416((uint)(fVar35 * 8.5 + auVar26._0_4_)),0xb);
  auVar45._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar45._0_4_ = fVar35 * 9.5;
  auVar96._8_4_ = 0x80000000;
  auVar96._0_8_ = 0x8000000080000000;
  auVar96._12_4_ = 0x80000000;
  auVar77._8_4_ = 0x3effffff;
  auVar77._0_8_ = 0x3effffff3effffff;
  auVar77._12_4_ = 0x3effffff;
  auVar27 = vpternlogd_avx512vl(auVar77,auVar45,auVar96,0xf8);
  auVar27 = vroundss_avx(auVar45,ZEXT416((uint)(fVar35 * 9.5 + auVar27._0_4_)),0xb);
  auVar46._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar46._0_4_ = fVar35 * 10.5;
  auVar97._8_4_ = 0x80000000;
  auVar97._0_8_ = 0x8000000080000000;
  auVar97._12_4_ = 0x80000000;
  auVar78._8_4_ = 0x3effffff;
  auVar78._0_8_ = 0x3effffff3effffff;
  auVar78._12_4_ = 0x3effffff;
  auVar28 = vpternlogd_avx512vl(auVar78,auVar46,auVar97,0xf8);
  auVar28 = vroundss_avx(auVar46,ZEXT416((uint)(fVar35 * 10.5 + auVar28._0_4_)),0xb);
  auVar47._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar47._0_4_ = fVar35 * 11.5;
  auVar98._8_4_ = 0x80000000;
  auVar98._0_8_ = 0x8000000080000000;
  auVar98._12_4_ = 0x80000000;
  auVar79._8_4_ = 0x3effffff;
  auVar79._0_8_ = 0x3effffff3effffff;
  auVar79._12_4_ = 0x3effffff;
  auVar29 = vpternlogd_avx512vl(auVar79,auVar47,auVar98,0xf8);
  auVar29 = vroundss_avx(auVar47,ZEXT416((uint)(fVar35 * 11.5 + auVar29._0_4_)),0xb);
  fVar35 = fVar33 + auVar21._0_4_;
  fVar1 = fVar33 + auVar20._0_4_;
  fVar2 = fVar33 - auVar20._0_4_;
  fVar3 = fVar33 - auVar21._0_4_;
  fVar31 = fVar33 - auVar22._0_4_;
  fVar32 = fVar33 - auVar23._0_4_;
  fVar4 = fVar33 - auVar24._0_4_;
  fVar33 = fVar33 - auVar25._0_4_;
  fVar5 = fVar34 - auVar22._0_4_;
  fVar6 = fVar34 - auVar23._0_4_;
  fVar7 = fVar34 - auVar24._0_4_;
  fVar8 = fVar34 - auVar25._0_4_;
  fVar9 = fVar34 - auVar26._0_4_;
  fVar10 = fVar34 - auVar27._0_4_;
  fVar11 = fVar34 - auVar28._0_4_;
  fVar34 = fVar34 - auVar29._0_4_;
  gauss_s1_c0[0] = expf(fVar30 * fVar35 * fVar35);
  gauss_s1_c0[1] = expf(fVar30 * fVar1 * fVar1);
  gauss_s1_c0[2] = expf(fVar30 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar30 * fVar3 * fVar3);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar30 * fVar31 * fVar31);
  gauss_s1_c0[6] = expf(fVar30 * fVar32 * fVar32);
  gauss_s1_c0[7] = expf(fVar30 * fVar4 * fVar4);
  gauss_s1_c0[8] = expf(fVar30 * fVar33 * fVar33);
  gauss_s1_c1[0] = expf(fVar30 * fVar5 * fVar5);
  gauss_s1_c1[1] = expf(fVar30 * fVar6 * fVar6);
  gauss_s1_c1[2] = expf(fVar30 * fVar7 * fVar7);
  gauss_s1_c1[3] = expf(fVar30 * fVar8 * fVar8);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar30 * fVar9 * fVar9);
  gauss_s1_c1[6] = expf(fVar30 * fVar10 * fVar10);
  gauss_s1_c1[7] = expf(fVar30 * fVar11 * fVar11);
  gauss_s1_c1[8] = expf(fVar30 * fVar34 * fVar34);
  for (local_1c8 = -8; local_1c8 < 8; local_1c8 = local_1c8 + 5) {
    if ((local_1c8 == -8) || (local_1c8 == 7)) {
      local_1d0 = gauss_s1_c1;
    }
    else {
      local_1d0 = gauss_s1_c0;
    }
    iVar12 = 0;
    if (local_1c8 < 0) {
      iVar12 = 8;
    }
    iVar13 = 1;
    if (local_1c8 < 0) {
      iVar13 = -1;
    }
    for (local_1dc = -8; local_1dc < 8; local_1dc = local_1dc + 5) {
      if ((local_1dc == -8) || (local_1dc == 7)) {
        local_1e8 = gauss_s1_c1;
      }
      else {
        local_1e8 = gauss_s1_c0;
      }
      local_1ec = 0.0;
      local_1f0 = 0.0;
      local_1f4 = 0.0;
      local_1f8 = 0.0;
      local_1fc = 0;
      if (local_1dc < 0) {
        local_1fc = 8;
      }
      iVar14 = 1;
      if (local_1dc < 0) {
        iVar14 = -1;
      }
      for (local_204 = (local_1dc + 8) * 0x18;
          SBORROW4(local_204,(local_1dc + 0x11) * 0x18) !=
          local_204 + (local_1dc + 0x11) * -0x18 < 0; local_204 = local_204 + 0x18) {
        local_20c = iVar12;
        for (local_210 = local_1c8 + 8; local_210 < local_1c8 + 0x11; local_210 = local_210 + 1) {
          fVar35 = local_1d0[local_20c] * local_1e8[local_1fc] *
                   haarResponseY[local_204 + local_210];
          fVar1 = local_1d0[local_20c] * local_1e8[local_1fc] * haarResponseX[local_204 + local_210]
          ;
          local_1ec = fVar35 + local_1ec;
          local_1f0 = fVar1 + local_1f0;
          auVar80._8_4_ = 0x7fffffff;
          auVar80._0_8_ = 0x7fffffff7fffffff;
          auVar80._12_4_ = 0x7fffffff;
          auVar20 = vpand_avx(ZEXT416((uint)fVar35),auVar80);
          local_1f4 = auVar20._0_4_ + local_1f4;
          auVar81._8_4_ = 0x7fffffff;
          auVar81._0_8_ = 0x7fffffff7fffffff;
          auVar81._12_4_ = 0x7fffffff;
          auVar20 = vpand_avx(ZEXT416((uint)fVar1),auVar81);
          local_1f8 = auVar20._0_4_ + local_1f8;
          local_20c = iVar13 + local_20c;
        }
        local_1fc = iVar14 + local_1fc;
      }
      fVar35 = gauss_s2_arr[local_54];
      local_54 = local_54 + 1;
      local_1ec = local_1ec * fVar35;
      local_1f0 = local_1f0 * fVar35;
      local_1f4 = local_1f4 * fVar35;
      local_1f8 = local_1f8 * fVar35;
      in_RSI[(long)local_4c + 5] = local_1ec;
      in_RSI[(long)(local_4c + 1) + 5] = local_1f0;
      in_RSI[(long)(local_4c + 2) + 5] = local_1f4;
      in_RSI[(long)(local_4c + 3) + 5] = local_1f8;
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_1ec),ZEXT416((uint)local_1ec),
                                ZEXT416((uint)(local_1f0 * local_1f0)));
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_1f4),ZEXT416((uint)local_1f4),auVar20);
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)local_1f8),ZEXT416((uint)local_1f8),auVar20);
      local_50 = auVar20._0_4_ + local_50;
      local_4c = local_4c + 4;
    }
  }
  fVar35 = sqrtf(local_50);
  for (local_244 = 0; local_244 < 0x40; local_244 = local_244 + 1) {
    in_RSI[(long)local_244 + 5] = (1.0 / fVar35) * in_RSI[(long)local_244 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_6_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}